

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation.cpp
# Opt level: O3

void QAbstractAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Direction *pDVar1;
  parameter_type *ppVar2;
  code *pcVar3;
  long lVar4;
  QBindingStatus *pQVar5;
  parameter_type pVar6;
  QBindableInterface *pQVar7;
  long *plVar8;
  int iVar9;
  QUntypedPropertyData *data;
  State newState;
  Direction msecs;
  QObjectData *pQVar10;
  QAbstractAnimationPrivate *this;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
        return;
      }
      goto LAB_003a3431;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        stateChanged((QAbstractAnimation *)_o,*_a[1],*_a[2]);
        return;
      }
      goto LAB_003a3431;
    case 2:
      local_2c = *_a[1];
      iVar9 = 2;
      goto LAB_003a3362;
    case 3:
      local_2c = *_a[1];
      iVar9 = 3;
LAB_003a3362:
      local_20 = &local_2c;
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar9,&local_28);
      break;
    case 4:
      this = (QAbstractAnimationPrivate *)(_o->d_ptr).d;
      if ((this->state).super_QPropertyData<QAbstractAnimation::State>.val != Running) {
        this->deleteWhenStopped = *_a[1] != 0;
LAB_003a33ad:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          newState = Running;
LAB_003a33c2:
          QAbstractAnimationPrivate::setState(this,newState);
          return;
        }
        goto LAB_003a3431;
      }
      break;
    case 5:
      this = (QAbstractAnimationPrivate *)(_o->d_ptr).d;
      if ((this->state).super_QPropertyData<QAbstractAnimation::State>.val != Running) {
        this->deleteWhenStopped = false;
        goto LAB_003a33ad;
      }
      break;
    case 6:
      goto switchD_003a3068_caseD_6;
    case 7:
switchD_003a3068_caseD_7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        resume((QAbstractAnimation *)_o);
        return;
      }
      goto LAB_003a3431;
    case 8:
      if (*_a[1] != '\x01') goto switchD_003a3068_caseD_7;
      goto switchD_003a3068_caseD_6;
    case 9:
      this = (QAbstractAnimationPrivate *)(_o->d_ptr).d;
      if ((this->state).super_QPropertyData<QAbstractAnimation::State>.val != Stopped) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_003a3431;
        newState = Stopped;
        goto LAB_003a33c2;
      }
      break;
    case 10:
      msecs = *_a[1];
LAB_003a33d4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCurrentTime((QAbstractAnimation *)_o,msecs);
        return;
      }
      goto LAB_003a3431;
    }
    break;
  case ReadProperty:
    if (5 < (uint)_id) break;
    ppVar2 = (parameter_type *)*_a;
    switch(_id) {
    case 0:
      pQVar10 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)&pQVar10[1].children.d.size;
      goto LAB_003a3271;
    case 1:
      pQVar10 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)&pQVar10[1].metaObject;
LAB_003a3271:
      pQVar5 = (pQVar10->bindingStorage).bindingStatus;
      if ((pQVar5 != (QBindingStatus *)0x0) &&
         (pQVar5->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(&pQVar10->bindingStorage,data);
      }
      pVar6 = *(parameter_type *)data;
      break;
    case 2:
      pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                       *)&(_o->d_ptr).d[1].field_0x30);
      break;
    case 3:
      pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                       *)((long)&(_o->d_ptr).d[1].metaObject + 4));
      break;
    case 4:
      pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                       *)((long)&(_o->d_ptr).d[1].children.d.size + 4));
      break;
    case 5:
      pVar6 = (*_o->_vptr_QObject[0xc])();
    }
    *ppVar2 = pVar6;
    break;
  case WriteProperty:
    pDVar1 = (Direction *)*_a;
    if (_id == 4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setDirection((QAbstractAnimation *)_o,*pDVar1);
        return;
      }
      goto LAB_003a3431;
    }
    if (_id == 2) {
      msecs = *pDVar1;
      goto LAB_003a33d4;
    }
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
        ::setValue((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                    *)&(_o->d_ptr).d[1].metaObject,*pDVar1);
        return;
      }
      goto LAB_003a3431;
    }
    break;
  case IndexOfMethod:
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == finished && lVar4 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar3 == stateChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar3 == currentLoopChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar3 == directionChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 3;
    }
    break;
  case BindableProperty:
    switch(_id) {
    case 0:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[1].children.d.size;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<const_QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>,_void>
                ::iface;
      break;
    case 1:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[1].metaObject;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>,_void>
                ::iface;
      break;
    case 2:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[1].field_0x30;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 3:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[1].metaObject + 4);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<const_QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>,_void>
                ::iface;
      break;
    case 4:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[1].children.d.size + 4);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>,_void>
                ::iface;
      break;
    default:
      goto switchD_003a304c_caseD_3;
    }
    plVar8[1] = (long)pQVar7;
  }
switchD_003a304c_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003a3431:
  __stack_chk_fail();
switchD_003a3068_caseD_6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    pause((QAbstractAnimation *)_o);
    return;
  }
  goto LAB_003a3431;
}

Assistant:

void QAbstractAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractAnimation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished(); break;
        case 1: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::State>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::State>>(_a[2]))); break;
        case 2: _t->currentLoopChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->directionChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::Direction>>(_a[1]))); break;
        case 4: _t->start((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::DeletionPolicy>>(_a[1]))); break;
        case 5: _t->start(); break;
        case 6: _t->pause(); break;
        case 7: _t->resume(); break;
        case 8: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 9: _t->stop(); break;
        case 10: _t->setCurrentTime((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)()>(_a, &QAbstractAnimation::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(QAbstractAnimation::State , QAbstractAnimation::State )>(_a, &QAbstractAnimation::stateChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(int )>(_a, &QAbstractAnimation::currentLoopChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(QAbstractAnimation::Direction )>(_a, &QAbstractAnimation::directionChanged, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<State*>(_v) = _t->state(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->loopCount(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentTime(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->currentLoop(); break;
        case 4: *reinterpret_cast<Direction*>(_v) = _t->direction(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setLoopCount(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setCurrentTime(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setDirection(*reinterpret_cast<Direction*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableState(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableLoopCount(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentTime(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentLoop(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDirection(); break;
        default: break;
        }
    }
}